

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::tempSubString
          (UnicodeString *__return_storage_ptr__,UnicodeString *this,int32_t start,int32_t len)

{
  char16_t *pcVar1;
  int32_t len_local;
  int32_t start_local;
  ConstChar16Ptr local_18;
  
  len_local = len;
  start_local = start;
  pinIndices(this,&start_local,&len_local);
  pcVar1 = getBuffer(this);
  if (pcVar1 == (char16_t *)0x0) {
    pcVar1 = (this->fUnion).fStackFields.fBuffer;
    len_local = -2;
  }
  local_18.p_ = pcVar1 + start_local;
  UnicodeString(__return_storage_ptr__,'\0',&local_18,len_local);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
UnicodeString::tempSubString(int32_t start, int32_t len) const {
  pinIndices(start, len);
  const UChar *array = getBuffer();  // not getArrayStart() to check kIsBogus & kOpenGetBuffer
  if(array==NULL) {
    array=fUnion.fStackFields.fBuffer;  // anything not NULL because that would make an empty string
    len=-2;  // bogus result string
  }
  return UnicodeString(FALSE, array + start, len);
}